

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lzma_encoder_optimum_normal.c
# Opt level: O3

void lzma_lzma_optimum_normal
               (lzma_coder_conflict9 *coder,lzma_mf *mf,uint32_t *back_res,uint32_t *len_res,
               uint32_t position)

{
  uint32_t *puVar1;
  lzma_lzma_state *plVar2;
  byte bVar3;
  byte bVar4;
  short sVar5;
  ushort uVar6;
  ushort uVar7;
  uint8_t *puVar8;
  undefined8 uVar9;
  lzma_mf *plVar10;
  uint32_t uVar11;
  uint32_t uVar12;
  short *psVar13;
  sbyte sVar14;
  int iVar15;
  uint32_t *puVar16;
  uint32_t *puVar17;
  lzma_lzma_state lVar18;
  uint32_t price;
  int iVar19;
  ulong uVar20;
  byte bVar21;
  uint32_t uVar22;
  uint uVar23;
  uint uVar24;
  lzma_lzma_state lVar25;
  uint uVar26;
  uint uVar27;
  long lVar28;
  ulong uVar29;
  uint uVar30;
  int iVar31;
  undefined4 in_register_00000084;
  ulong uVar32;
  ulong uVar33;
  long lVar34;
  short *psVar35;
  short *psVar36;
  uint32_t pos_prev;
  short *psVar37;
  uint uVar38;
  long lVar39;
  ulong uVar40;
  uint uVar41;
  ulong uVar42;
  int iVar43;
  uint uVar44;
  uint32_t model_index;
  bool bVar45;
  bool bVar46;
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  int iVar57;
  int iVar59;
  undefined1 auVar58 [16];
  int iVar61;
  undefined1 auVar60 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  uint32_t reps [4];
  ulong local_188;
  uint local_148 [3];
  uint32_t uStack_13c;
  uint32_t *local_138;
  uint *local_130;
  lzma_mf *local_128;
  short *local_120;
  ulong local_118;
  uint local_110;
  uint local_10c;
  uint local_108;
  uint local_104;
  ulong local_100;
  uint32_t *local_f8;
  uint32_t *local_f0;
  uint32_t (*local_e8) [272];
  ulong local_e0;
  probability (*local_d8) [16];
  uint32_t (*local_d0) [272];
  long local_c8;
  uint32_t *local_c0;
  probability (*local_b8) [16];
  undefined8 local_b0;
  ulong local_a8;
  ulong local_a0;
  lzma_match *local_98;
  uint32_t (*local_90) [272];
  uint32_t local_88;
  uint local_84;
  ulong local_80;
  ulong local_78;
  uint32_t *local_70;
  ulong local_68;
  probability *local_60;
  long local_58;
  ulong local_50;
  ulong local_48;
  uint32_t (*local_40) [128];
  uint32_t (*local_38) [64];
  
  local_b0 = CONCAT44(in_register_00000084,position);
  uVar38 = coder->opts_current_index;
  uVar11 = mf->read_ahead;
  local_138 = back_res;
  local_130 = len_res;
  if (coder->opts_end_index != uVar38) {
    if (uVar11 == 0) {
      __assert_fail("mf->read_ahead > 0",
                    "/workspace/llm4binary/github/license_c_cmakelists/jdavidberger[P]CMake/Utilities/cmliblzma/liblzma/lzma/lzma_encoder_optimum_normal.c"
                    ,0x36e,
                    "void lzma_lzma_optimum_normal(lzma_coder *restrict, lzma_mf *restrict, uint32_t *restrict, uint32_t *restrict, uint32_t)"
                   );
    }
    uVar11 = coder->opts[uVar38].pos_prev;
    uVar22 = coder->opts[uVar38].back_prev;
    coder->opts_current_index = uVar11;
    *len_res = uVar11 - uVar38;
LAB_004ebed2:
    *local_138 = uVar22;
    return;
  }
  if (uVar11 == 0) {
    if (0x7f < coder->match_price_count) {
      puVar17 = coder->pos_slot_prices[0] + 0xe;
      lVar34 = 0;
      do {
        puVar16 = coder->pos_slot_prices[lVar34];
        if (coder->dist_table_size != 0) {
          uVar20 = 0;
          do {
            uVar22 = 0;
            uVar38 = (int)uVar20 + 0x40;
            do {
              uVar44 = uVar38 >> 1;
              uVar22 = uVar22 + lzma_rc_prices
                                [(-(uVar38 & 1) & 0x7f0 ^
                                 (uint)*(ushort *)
                                        ((long)coder->pos_slot[lVar34] +
                                        (ulong)(uVar38 & 0xfffffffe))) >> 4];
              uVar38 = uVar44;
            } while (uVar44 != 1);
            puVar16[uVar20] = uVar22;
            uVar20 = uVar20 + 1;
          } while (uVar20 < coder->dist_table_size);
          if (0xe < coder->dist_table_size) {
            uVar38 = 0x70;
            lVar39 = 0;
            do {
              puVar17[lVar39] = (puVar17[lVar39] + (uVar38 & 0xfffffff0)) - 0x50;
              uVar20 = lVar39 + 0xf;
              uVar38 = uVar38 + 8;
              lVar39 = lVar39 + 1;
            } while (uVar20 < coder->dist_table_size);
          }
        }
        uVar9 = *(undefined8 *)(puVar16 + 2);
        puVar1 = coder->distances_prices[lVar34];
        *(undefined8 *)puVar1 = *(undefined8 *)puVar16;
        *(undefined8 *)(puVar1 + 2) = uVar9;
        lVar34 = lVar34 + 1;
        puVar17 = puVar17 + 0x40;
      } while (lVar34 != 4);
      puVar17 = coder->distances_prices[0] + 4;
      lVar34 = 4;
      do {
        bVar3 = ""[lVar34];
        iVar15 = (bVar3 >> 1) - 1;
        bVar21 = (byte)iVar15 & 0x1f;
        uVar44 = (bVar3 & 1 | 2) << bVar21;
        uVar23 = (int)lVar34 - uVar44;
        uVar38 = 1;
        iVar19 = 0 << bVar21;
        do {
          uVar41 = uVar23 & 1;
          uVar20 = (ulong)uVar38;
          uVar38 = uVar41 + uVar38 * 2;
          uVar23 = uVar23 >> 1;
          iVar19 = iVar19 + (uint)lzma_rc_prices
                                  [(-uVar41 & 0x7f0 ^
                                   (uint)*(ushort *)
                                          ((long)coder +
                                          uVar20 * 2 +
                                          ((ulong)uVar44 * 2 - (ulong)((uint)bVar3 + (uint)bVar3)) +
                                          0x70fa)) >> 4];
          iVar15 = iVar15 + -1;
        } while (iVar15 != 0);
        lVar39 = 0;
        do {
          *(int *)((long)puVar17 + lVar39 * 2) =
               *(int *)((long)coder->pos_slot_prices[0] + lVar39 + (ulong)bVar3 * 4) + iVar19;
          lVar39 = lVar39 + 0x100;
        } while (lVar39 != 0x400);
        lVar34 = lVar34 + 1;
        puVar17 = puVar17 + 1;
      } while (lVar34 != 0x80);
      coder->match_price_count = 0;
    }
    if (0xf < coder->align_price_count) {
      uVar20 = 0;
      do {
        uVar38 = 1;
        iVar15 = -4;
        uVar40 = uVar20 & 0xffffffff;
        uVar22 = 0;
        do {
          uVar44 = (uint)uVar40 & 1;
          uVar32 = (ulong)uVar38;
          uVar38 = uVar44 + uVar38 * 2;
          uVar40 = uVar40 >> 1;
          uVar22 = uVar22 + lzma_rc_prices[(-uVar44 & 0x7f0 ^ (uint)coder->pos_align[uVar32]) >> 4];
          iVar15 = iVar15 + 1;
        } while (iVar15 != 0);
        coder->align_prices[uVar20] = uVar22;
        uVar20 = uVar20 + 1;
      } while (uVar20 != 0x10);
      coder->align_price_count = 0;
    }
  }
  uVar38 = mf->nice_len;
  local_128 = mf;
  if (uVar11 == 1) {
    local_104 = coder->matches_count;
    uVar44 = coder->longest_match_length;
  }
  else {
    if (uVar11 != 0) {
      __assert_fail("mf->read_ahead == 1",
                    "/workspace/llm4binary/github/license_c_cmakelists/jdavidberger[P]CMake/Utilities/cmliblzma/liblzma/lzma/lzma_encoder_optimum_normal.c"
                    ,0x136,
                    "uint32_t helper1(lzma_coder *restrict, lzma_mf *restrict, uint32_t *restrict, uint32_t *restrict, uint32_t)"
                   );
    }
    uVar44 = lzma_mf_find(mf,&local_104,coder->matches);
  }
  uVar20 = (ulong)mf->read_pos;
  uVar41 = (mf->write_pos - mf->read_pos) + 1;
  uVar23 = 0x111;
  if ((0x110 < uVar41) || (uVar23 = uVar41, 1 < uVar41)) {
    puVar8 = mf->buffer;
    puVar17 = coder->reps;
    sVar5 = *(short *)(puVar8 + (uVar20 - 1));
    lVar34 = 0;
    uVar41 = 0;
    do {
      if (sVar5 == *(short *)(puVar8 + (uVar20 - 2) + -(ulong)puVar17[lVar34])) {
        uVar40 = 2;
        if (2 < uVar23) {
          uVar40 = 2;
          do {
            if (puVar8[uVar40 + (uVar20 - 1)] != puVar8[uVar40 + (uVar20 - puVar17[lVar34]) + -2])
            goto LAB_004ebf85;
            uVar40 = uVar40 + 1;
          } while (uVar23 != uVar40);
          uVar40 = (ulong)uVar23;
        }
LAB_004ebf85:
        local_148[lVar34] = (uint)uVar40;
        if (local_148[uVar41] < (uint)uVar40) {
          uVar41 = (uint)lVar34;
        }
      }
      else {
        local_148[lVar34] = 0;
      }
      lVar34 = lVar34 + 1;
    } while (lVar34 != 4);
    uVar23 = local_148[uVar41];
    if (uVar38 <= uVar23) {
      *local_138 = uVar41;
      *local_130 = uVar23;
      uVar11 = uVar23 - 1;
      if (uVar11 == 0) {
        return;
      }
      (*mf->skip)(mf,uVar11);
      mf->read_ahead = mf->read_ahead + uVar11;
      return;
    }
    if (uVar38 <= uVar44) {
      *local_138 = coder->matches[local_104 - 1].dist + 4;
      *local_130 = uVar44;
      uVar11 = uVar44 - 1;
      if (uVar11 == 0) {
        return;
      }
      (*mf->skip)(mf,uVar11);
      mf->read_ahead = mf->read_ahead + uVar11;
      return;
    }
    bVar3 = puVar8[~(ulong)*puVar17 + (uVar20 - 1)];
    bVar21 = (byte)sVar5;
    if (((1 < uVar23) || (1 < uVar44)) || (bVar3 == bVar21)) {
      uVar40 = (ulong)coder->state;
      local_e0 = CONCAT71(local_e0._1_7_,bVar3);
      coder->opts[0].state = coder->state;
      uVar38 = coder->pos_mask & (uint)local_b0;
      uVar32 = (ulong)(coder->is_match[uVar40][uVar38] >> 4);
      local_90 = (uint32_t (*) [272])CONCAT44(local_90._4_4_,(uint)lzma_rc_prices[uVar32]);
      uVar11 = get_literal_price(coder,(uint)local_b0,(uint)puVar8[uVar20 - 2],6 < uVar40,
                                 (uint)bVar3,(uint)bVar21);
      coder->opts[1].price = uVar11 + (int)local_90;
      coder->opts[1].back_prev = 0xffffffff;
      coder->opts[1].prev_1_is_literal = false;
      bVar3 = lzma_rc_prices[uVar32 ^ 0x7f];
      uVar20 = (ulong)(coder->is_rep[uVar40] >> 4);
      iVar15 = (uint)lzma_rc_prices[uVar20 ^ 0x7f] + (uint)bVar3;
      uVar22 = 0xffffffff;
      if (((byte)local_e0 == bVar21) &&
         (uVar41 = (uint)lzma_rc_prices[coder->is_rep0_long[uVar40][uVar38] >> 4] +
                   (uint)lzma_rc_prices[coder->is_rep0[uVar40] >> 4] + iVar15,
         uVar41 < uVar11 + (int)local_90)) {
        coder->opts[1].price = uVar41;
        coder->opts[1].back_prev = 0;
        uVar22 = 0;
      }
      if (uVar23 < uVar44) {
        uVar23 = uVar44;
      }
      local_188 = (ulong)uVar23;
      if (1 < uVar23) {
        local_d8 = coder->is_match;
        coder->opts[1].pos_prev = 0;
        local_c0 = coder->opts[0].backs;
        uVar9 = *(undefined8 *)(coder->reps + 2);
        *(undefined8 *)coder->opts[0].backs = *(undefined8 *)coder->reps;
        *(undefined8 *)(coder->opts[0].backs + 2) = uVar9;
        auVar62 = _DAT_00583f20;
        auVar64 = _DAT_0057a050;
        auVar63 = _DAT_0057a040;
        uVar41 = uVar23 - 2;
        auVar47._4_4_ = 0;
        auVar47._0_4_ = uVar41;
        auVar47._8_4_ = uVar41;
        auVar47._12_4_ = 0;
        puVar16 = coder->align_prices + local_188 * 0xb + -10;
        uVar32 = 0;
        auVar47 = auVar47 ^ _DAT_0057a050;
        do {
          auVar58._8_4_ = (int)uVar32;
          auVar58._0_8_ = uVar32;
          auVar58._12_4_ = (int)(uVar32 >> 0x20);
          auVar60 = (auVar58 | auVar63) ^ auVar64;
          iVar19 = auVar47._0_4_;
          bVar46 = iVar19 < auVar60._0_4_;
          iVar43 = auVar47._4_4_;
          iVar31 = auVar60._4_4_;
          if ((bool)(~(iVar43 < iVar31 || iVar31 == iVar43 && bVar46) & 1)) {
            puVar16[0x21] = 0x40000000;
          }
          if (iVar43 >= iVar31 && (iVar31 != iVar43 || !bVar46)) {
            puVar16[0x16] = 0x40000000;
          }
          auVar58 = (auVar58 | auVar62) ^ auVar64;
          iVar31 = auVar58._4_4_;
          if (iVar31 <= iVar43 && (iVar31 != iVar43 || auVar58._0_4_ <= iVar19)) {
            puVar16[0xb] = 0x40000000;
            *puVar16 = 0x40000000;
          }
          uVar32 = uVar32 + 4;
          puVar16 = puVar16 + -0x2c;
        } while (((ulong)uVar41 + 4 & 0xfffffffffffffffc) != uVar32);
        local_b8 = coder->is_rep0_long;
        local_d0 = (coder->rep_len_encoder).prices;
        lVar34 = 0;
        do {
          uVar41 = local_148[lVar34];
          if (1 < uVar41) {
            uVar6 = coder->is_rep0[uVar40] >> 4;
            if (lVar34 == 0) {
              uVar24 = (uint)lzma_rc_prices[uVar6];
              bVar21 = lzma_rc_prices[(ulong)(coder->is_rep0_long[uVar40][uVar38] >> 4) ^ 0x7f];
LAB_004ec3e6:
              iVar19 = bVar21 + uVar24;
            }
            else {
              uVar24 = (uint)lzma_rc_prices[(ulong)uVar6 ^ 0x7f];
              uVar6 = coder->is_rep1[uVar40] >> 4;
              if (lVar34 == 1) {
                bVar21 = lzma_rc_prices[uVar6];
                goto LAB_004ec3e6;
              }
              iVar19 = (uint)lzma_rc_prices
                             [(2 - (uint32_t)lVar34 & 0x7f0 ^ (uint)coder->is_rep2[uVar40]) >> 4] +
                       lzma_rc_prices[(ulong)uVar6 ^ 0x7f] + uVar24;
            }
            puVar16 = (coder->rep_len_encoder).prices[uVar38] + (uVar41 - 2);
            do {
              uVar24 = *puVar16 + iVar19 + iVar15;
              if (uVar24 < coder->opts[uVar41].price) {
                coder->opts[uVar41].price = uVar24;
                coder->opts[uVar41].pos_prev = 0;
                coder->opts[uVar41].back_prev = (uint32_t)lVar34;
                coder->opts[uVar41].prev_1_is_literal = false;
              }
              uVar41 = uVar41 - 1;
              puVar16 = puVar16 + -1;
            } while (1 < uVar41);
          }
          lVar34 = lVar34 + 1;
        } while (lVar34 != 4);
        uVar40 = 2;
        if (1 < local_148[0]) {
          uVar40 = (ulong)(local_148[0] + 1);
        }
        if ((uint)uVar40 <= uVar44) {
          bVar21 = lzma_rc_prices[uVar20];
          uVar20 = 0xffffffff;
          do {
            uVar20 = (ulong)((int)uVar20 + 1);
          } while (coder->matches[uVar20].len < (uint)uVar40);
          while( true ) {
            uVar44 = coder->matches[uVar20].dist;
            uVar41 = (uint)uVar40;
            uVar24 = 3;
            if (uVar41 < 6) {
              uVar24 = uVar41 - 2;
            }
            if ((ulong)uVar44 < 0x80) {
              uVar11 = coder->distances_prices[uVar24][uVar44];
            }
            else {
              sVar14 = 0x1e;
              if (-1 < (int)uVar44) {
                sVar14 = 0x12;
              }
              iVar15 = 0x3c;
              if (-1 < (int)uVar44) {
                iVar15 = 0x24;
              }
              if (uVar44 < 0x80000) {
                sVar14 = 6;
              }
              if (uVar44 < 0x80000) {
                iVar15 = 0xc;
              }
              uVar11 = coder->align_prices[uVar44 & 0xf] +
                       coder->pos_slot_prices[uVar24][(uint)""[uVar44 >> sVar14] + iVar15];
            }
            uVar24 = uVar11 + (uint)bVar21 + (uint)bVar3 +
                     (coder->match_len_encoder).prices[uVar38][uVar41 - 2];
            if (uVar24 < coder->opts[uVar40].price) {
              coder->opts[uVar40].price = uVar24;
              coder->opts[uVar40].pos_prev = 0;
              coder->opts[uVar40].back_prev = uVar44 + 4;
              coder->opts[uVar40].prev_1_is_literal = false;
            }
            uVar44 = coder->matches[uVar20].len;
            uVar24 = (int)uVar20 + 1;
            if ((uVar41 == uVar44) && (uVar24 == local_104)) break;
            uVar32 = (ulong)uVar24;
            if (uVar41 != uVar44) {
              uVar32 = uVar20;
            }
            uVar40 = (ulong)(uVar41 + 1);
            uVar20 = uVar32;
          }
        }
        if (uVar23 == 0xffffffff) {
          return;
        }
        local_148[0] = (uint)*(undefined8 *)puVar17;
        local_148[1] = (uint)((ulong)*(undefined8 *)puVar17 >> 0x20);
        local_148[2] = (uint)*(undefined8 *)(coder->reps + 2);
        uStack_13c = (uint32_t)((ulong)*(undefined8 *)(coder->reps + 2) >> 0x20);
        local_f0 = &coder->matches_count;
        local_98 = coder->matches;
        local_90 = (coder->match_len_encoder).prices;
        local_38 = coder->pos_slot_prices;
        local_40 = coder->distances_prices;
        local_70 = coder->opts[1].backs;
        local_f8 = &coder->opts[4].price;
        iVar15 = (int)local_b0;
        iVar19 = 0xffe;
        lVar34 = 0;
        uVar20 = 1;
        do {
          puVar17 = local_f0;
          plVar10 = local_128;
          local_a8 = (ulong)(iVar15 + 1);
          local_e0 = CONCAT44(local_e0._4_4_,iVar19);
          if (lVar34 == 0xfff) {
            __assert_fail("cur < OPTS",
                          "/workspace/llm4binary/github/license_c_cmakelists/jdavidberger[P]CMake/Utilities/cmliblzma/liblzma/lzma/lzma_encoder_optimum_normal.c"
                          ,0x38e,
                          "void lzma_lzma_optimum_normal(lzma_coder *restrict, lzma_mf *restrict, uint32_t *restrict, uint32_t *restrict, uint32_t)"
                         );
          }
          uVar11 = lzma_mf_find(local_128,local_f0,local_98);
          local_68 = (ulong)uVar11;
          coder->longest_match_length = uVar11;
          local_118 = (ulong)plVar10->nice_len;
          if (plVar10->nice_len <= uVar11) {
            local_80 = uVar20 & 0xffffffff;
            break;
          }
          puVar8 = plVar10->buffer;
          uVar40 = (ulong)plVar10->read_pos;
          local_110 = (plVar10->write_pos - plVar10->read_pos) + 1;
          uVar11 = (uint32_t)uVar20;
          local_108 = 0xfff - uVar11;
          if (local_110 < 0xfff - uVar11) {
            local_108 = local_110;
          }
          local_10c = *puVar17;
          plVar2 = &coder->opts[uVar20].state;
          uVar38 = coder->opts[uVar20].pos_prev;
          uVar32 = (ulong)uVar38;
          if (coder->opts[uVar20].prev_1_is_literal == true) {
            if (*(_Bool *)((long)plVar2 + 5) == true) {
              uVar29 = (ulong)plVar2[2];
              bVar45 = coder->opts[uVar29].state < STATE_LIT_MATCH;
              uVar38 = plVar2[3];
              bVar46 = !bVar45;
              iVar15 = (uint)bVar46 * 3 + 7;
              if (uVar38 < 4) {
                iVar15 = (uint)bVar46 * 3 + 8;
              }
              lVar18 = ((uint)bVar45 * 3 + iVar15) - STATE_SHORTREP_LIT;
              if (uVar20 != uVar32) {
                lVar25 = (uint)(STATE_SHORTREP_LIT < lVar18) * 3 + STATE_LIT_LONGREP;
                if (uVar38 < 4) goto LAB_004ec6e5;
LAB_004ec75b:
                local_148[0] = uVar38 - 4;
                uStack_13c = local_c0[uVar29 * 0xb + 2];
                local_148[1] = (uint)*(undefined8 *)(local_c0 + uVar29 * 0xb);
                local_148[2] = (uint)((ulong)*(undefined8 *)(local_c0 + uVar29 * 0xb) >> 0x20);
                goto LAB_004ec7a6;
              }
            }
            else {
              uVar38 = uVar38 - 1;
              lVar25 = coder->opts[uVar38].state;
              lVar18 = (lVar25 - STATE_SHORTREP_LIT) + (uint)(lVar25 < STATE_NONLIT_MATCH) * 3;
              if (lVar25 < STATE_MATCH_LIT) {
                lVar18 = STATE_LIT_LIT;
              }
              uVar29 = (ulong)uVar38;
              if (uVar20 != uVar32) goto LAB_004ec6cb;
            }
LAB_004ec674:
            if (plVar2[6] == 0) {
              lVar25 = (uint)(STATE_SHORTREP_LIT < lVar18) * 2 + STATE_LIT_SHORTREP;
            }
            else {
              lVar25 = (lVar18 - STATE_SHORTREP_LIT) + (uint)(lVar18 < STATE_NONLIT_MATCH) * 3;
              if (lVar18 < STATE_MATCH_LIT) {
                lVar25 = STATE_LIT_LIT;
              }
            }
          }
          else {
            lVar18 = coder->opts[uVar32].state;
            uVar29 = uVar32;
            if (uVar20 - 1 == uVar32) goto LAB_004ec674;
LAB_004ec6cb:
            uVar38 = plVar2[6];
            if (3 < uVar38) {
              lVar25 = (uint)(STATE_SHORTREP_LIT < lVar18) * 3 + STATE_LIT_MATCH;
              goto LAB_004ec75b;
            }
            lVar25 = (uint)(STATE_SHORTREP_LIT < lVar18) * 3 + STATE_LIT_LONGREP;
LAB_004ec6e5:
            local_148[0] = coder->opts[uVar29].backs[uVar38];
            if (uVar38 == 0) {
              uVar32 = 1;
              puVar17 = local_c0;
            }
            else {
              uVar32 = (ulong)(uVar38 + 1);
              memcpy(local_148 + 1,local_c0 + uVar29 * 0xb,uVar32 * 4 - 4);
              puVar17 = local_c0;
              if (2 < uVar38) goto LAB_004ec7a6;
            }
            do {
              local_148[uVar32] = *(uint32_t *)((long)puVar17 + (uVar29 * 0xb + uVar32) * 4);
              uVar32 = uVar32 + 1;
            } while ((int)uVar32 != 4);
          }
LAB_004ec7a6:
          puVar17 = local_70 + lVar34 * 0xb;
          uVar44 = uVar11 + (int)local_b0;
          local_a0 = (ulong)uVar44;
          *plVar2 = lVar25;
          *puVar17 = local_148[0];
          *(ulong *)(puVar17 + 1) = CONCAT44(local_148[2],local_148[1]);
          puVar17[3] = uStack_13c;
          uVar22 = plVar2[4];
          bVar3 = puVar8[uVar40 - 1];
          local_120 = (short *)(ulong)local_148[0];
          bVar21 = puVar8[(uVar40 - (long)local_120) + -2];
          uVar38 = coder->pos_mask;
          uVar32 = (ulong)(uVar38 & uVar44);
          uVar29 = (ulong)(local_d8[lVar25][uVar32] >> 4);
          bVar4 = lzma_rc_prices[uVar29];
          uVar12 = get_literal_price(coder,uVar44,(uint)puVar8[uVar40 - 2],
                                     STATE_SHORTREP_LIT < lVar25,(uint)bVar21,(uint)bVar3);
          uVar23 = uVar12 + uVar22 + (uint)bVar4;
          local_80 = uVar20 + 1;
          uVar44 = coder->opts[uVar20 + 1].price;
          bVar46 = uVar23 < uVar44;
          if (bVar46) {
            coder->opts[uVar20 + 1].price = uVar23;
            coder->opts[uVar20 + 1].pos_prev = uVar11;
            coder->opts[uVar20 + 1].back_prev = 0xffffffff;
            coder->opts[uVar20 + 1].prev_1_is_literal = false;
            uVar44 = uVar23;
          }
          auVar62 = _DAT_00583f20;
          auVar64 = _DAT_0057a050;
          auVar63 = _DAT_0057a040;
          iVar19 = uVar22 + lzma_rc_prices[uVar29 ^ 0x7f];
          uVar29 = (ulong)(coder->is_rep[lVar25] >> 4);
          iVar15 = (uint)lzma_rc_prices[uVar29 ^ 0x7f] + iVar19;
          local_c8 = CONCAT44(local_c8._4_4_,iVar15);
          if ((bVar21 == bVar3) &&
             (((uVar20 <= coder->opts[uVar20 + 1].pos_prev ||
               (coder->opts[uVar20 + 1].back_prev != 0)) &&
              (uVar41 = (uint)lzma_rc_prices[local_b8[lVar25][uVar32] >> 4] +
                        (uint)lzma_rc_prices[coder->is_rep0[lVar25] >> 4] + iVar15, uVar41 <= uVar44
              )))) {
            coder->opts[uVar20 + 1].price = uVar41;
            coder->opts[uVar20 + 1].pos_prev = uVar11;
            coder->opts[uVar20 + 1].back_prev = 0;
            coder->opts[uVar20 + 1].prev_1_is_literal = false;
            bVar46 = true;
          }
          local_100 = local_e0 & 0xffffffff;
          if (1 < local_108) {
            uVar41 = (uint)local_118;
            uVar44 = uVar41;
            if (local_108 < uVar41) {
              uVar44 = local_108;
            }
            uVar20 = (ulong)local_110;
            if (!(bool)(bVar21 == bVar3 | bVar46)) {
              uVar41 = uVar41 + 1;
              uVar24 = local_108;
              if (uVar41 < local_108) {
                uVar24 = uVar41;
              }
              if (1 < uVar24) {
                uVar42 = uVar20;
                if (local_100 < uVar20) {
                  uVar42 = local_100;
                }
                if (uVar41 <= uVar42) {
                  uVar42 = (ulong)uVar41;
                }
                uVar33 = 1;
                do {
                  if (puVar8[uVar33 + (uVar40 - 1)] !=
                      puVar8[uVar33 + (uVar40 - (long)local_120) + -2]) {
                    uVar24 = (uint)uVar33;
                    break;
                  }
                  uVar33 = uVar33 + 1;
                } while (uVar42 != uVar33);
                if (uVar24 - 3 < 0xfffffffe) {
                  uVar41 = (lVar25 - STATE_SHORTREP_LIT) + (uint)(lVar25 < STATE_NONLIT_MATCH) * 3;
                  if (lVar25 < STATE_MATCH_LIT) {
                    uVar41 = 0;
                  }
                  uVar26 = (int)local_a0 + 1U & uVar38;
                  uVar6 = local_d8[uVar41][uVar26];
                  uVar7 = coder->is_rep[uVar41];
                  uVar30 = uVar24 + uVar11;
                  if ((uint)local_188 < uVar30) {
                    lVar39 = ~local_188 + (ulong)uVar30;
                    auVar60._8_4_ = (int)lVar39;
                    auVar60._0_8_ = lVar39;
                    auVar60._12_4_ = (int)((ulong)lVar39 >> 0x20);
                    puVar17 = local_f8 + local_188 * 0xb;
                    uVar42 = 0;
                    do {
                      auVar52._8_4_ = (int)uVar42;
                      auVar52._0_8_ = uVar42;
                      auVar52._12_4_ = (int)(uVar42 >> 0x20);
                      auVar47 = (auVar52 | auVar63) ^ auVar64;
                      iVar15 = SUB164(auVar60 ^ auVar64,0);
                      bVar46 = iVar15 < auVar47._0_4_;
                      iVar43 = SUB164(auVar60 ^ auVar64,4);
                      iVar31 = auVar47._4_4_;
                      if ((bool)(~(iVar43 < iVar31 || iVar31 == iVar43 && bVar46) & 1)) {
                        puVar17[-0x21] = 0x40000000;
                      }
                      if (iVar43 >= iVar31 && (iVar31 != iVar43 || !bVar46)) {
                        puVar17[-0x16] = 0x40000000;
                      }
                      auVar47 = (auVar52 | auVar62) ^ auVar64;
                      iVar31 = auVar47._4_4_;
                      if (iVar31 <= iVar43 && (iVar31 != iVar43 || auVar47._0_4_ <= iVar15)) {
                        puVar17[-0xb] = 0x40000000;
                        *puVar17 = 0x40000000;
                      }
                      uVar42 = uVar42 + 4;
                      puVar17 = puVar17 + 0x2c;
                    } while ((((uVar24 + uVar11) - local_188) + 3 & 0xfffffffffffffffc) != uVar42);
                    local_188 = (ulong)uVar30;
                  }
                  uVar23 = uVar23 + lzma_rc_prices[(ulong)(uVar6 >> 4) ^ 0x7f] +
                           (uint)lzma_rc_prices[(ulong)(uVar7 >> 4) ^ 0x7f] +
                           local_d0[uVar26][uVar24 - 3] +
                           (uint)lzma_rc_prices[(ulong)(local_b8[uVar41][uVar26] >> 4) ^ 0x7f] +
                           (uint)lzma_rc_prices[coder->is_rep0[uVar41] >> 4];
                  if (uVar23 < coder->opts[uVar30].price) {
                    coder->opts[uVar30].price = uVar23;
                    coder->opts[uVar30].pos_prev = (uint32_t)local_80;
                    coder->opts[uVar30].back_prev = 0;
                    coder->opts[uVar30].prev_1_is_literal = true;
                    coder->opts[uVar30].prev_2 = false;
                  }
                }
              }
            }
            psVar35 = (short *)(puVar8 + (uVar40 - 1));
            sVar5 = *psVar35;
            local_60 = local_b8[lVar25] + uVar32;
            local_48 = local_100;
            if (local_118 < local_100) {
              local_48 = local_118;
            }
            if (uVar20 <= local_48) {
              local_48 = uVar20;
            }
            local_e0 = uVar32 * 0x440;
            local_e8 = local_d0 + uVar32;
            uVar20 = 2;
            local_58 = (long)*local_d8 +
                       (ulong)(((uint)(STATE_SHORTREP_LIT < lVar25) * 3 + 8) * 0x20);
            lVar39 = 0;
            local_120 = psVar35;
            local_78 = uVar29;
            do {
              psVar13 = (short *)(puVar8 + ((uVar40 - 2) - (ulong)local_148[lVar39]));
              if (sVar5 == *psVar13) {
                uVar32 = 2;
                if (2 < uVar44) {
                  uVar32 = 2;
                  do {
                    if (puVar8[uVar32 + (uVar40 - 1)] !=
                        puVar8[uVar32 + (uVar40 - local_148[lVar39]) + -2]) goto LAB_004ecd91;
                    uVar32 = uVar32 + 1;
                  } while (local_48 != uVar32);
                  uVar32 = (ulong)uVar44;
                }
LAB_004ecd91:
                iVar15 = (int)uVar32;
                uVar41 = iVar15 + uVar11;
                uVar23 = (uint)local_188;
                if ((uint)local_188 < uVar41) {
                  lVar28 = ~local_188 + (ulong)uVar41;
                  auVar48._8_4_ = (int)lVar28;
                  auVar48._0_8_ = lVar28;
                  auVar48._12_4_ = (int)((ulong)lVar28 >> 0x20);
                  puVar17 = local_f8 + local_188 * 0xb;
                  uVar29 = 0;
                  do {
                    auVar53._8_4_ = (int)uVar29;
                    auVar53._0_8_ = uVar29;
                    auVar53._12_4_ = (int)(uVar29 >> 0x20);
                    auVar47 = (auVar53 | auVar63) ^ auVar64;
                    iVar43 = SUB164(auVar48 ^ auVar64,0);
                    bVar46 = iVar43 < auVar47._0_4_;
                    iVar31 = SUB164(auVar48 ^ auVar64,4);
                    iVar57 = auVar47._4_4_;
                    if ((bool)(~(iVar31 < iVar57 || iVar57 == iVar31 && bVar46) & 1)) {
                      puVar17[-0x21] = 0x40000000;
                    }
                    if (iVar31 >= iVar57 && (iVar57 != iVar31 || !bVar46)) {
                      puVar17[-0x16] = 0x40000000;
                    }
                    auVar47 = (auVar53 | auVar62) ^ auVar64;
                    iVar57 = auVar47._4_4_;
                    if (iVar57 <= iVar31 && (iVar57 != iVar31 || auVar47._0_4_ <= iVar43)) {
                      puVar17[-0xb] = 0x40000000;
                      *puVar17 = 0x40000000;
                    }
                    uVar29 = uVar29 + 4;
                    puVar17 = puVar17 + 0x2c;
                    uVar23 = uVar41;
                  } while ((((uVar11 + iVar15) - local_188) + 3 & 0xfffffffffffffffc) != uVar29);
                }
                uVar6 = coder->is_rep0[lVar25] >> 4;
                uVar22 = (uint32_t)lVar39;
                if (lVar39 == 0) {
                  bVar3 = lzma_rc_prices[uVar6];
                  uVar29 = (ulong)(*local_60 >> 4) ^ 0x7f;
LAB_004ecf2f:
                  iVar43 = (uint)lzma_rc_prices[uVar29] + (uint)bVar3;
                }
                else {
                  bVar3 = lzma_rc_prices[(ulong)uVar6 ^ 0x7f];
                  uVar6 = coder->is_rep1[lVar25] >> 4;
                  uVar29 = (ulong)uVar6;
                  if (lVar39 == 1) goto LAB_004ecf2f;
                  iVar43 = (uint)lzma_rc_prices
                                 [(2 - uVar22 & 0x7f0 ^ (uint)coder->is_rep2[lVar25]) >> 4] +
                           (uint)lzma_rc_prices[(ulong)uVar6 ^ 0x7f] + (uint)bVar3;
                }
                iVar43 = iVar43 + (int)local_c8;
                puVar17 = *local_e8 + (iVar15 - 2U);
                uVar29 = uVar32 & 0xffffffff;
                do {
                  uVar24 = *puVar17 + iVar43;
                  uVar30 = uVar11 + (int)uVar29;
                  if (uVar24 < coder->opts[uVar30].price) {
                    coder->opts[uVar30].price = uVar24;
                    coder->opts[uVar30].pos_prev = uVar11;
                    coder->opts[uVar30].back_prev = uVar22;
                    coder->opts[uVar30].prev_1_is_literal = false;
                  }
                  uVar24 = (int)uVar29 - 1;
                  uVar29 = (ulong)uVar24;
                  puVar17 = puVar17 + -1;
                } while (1 < uVar24);
                uVar24 = iVar15 + 1;
                if (lVar39 == 0) {
                  uVar20 = (ulong)uVar24;
                }
                uVar26 = (int)local_118 + iVar15 + 1;
                uVar30 = local_108;
                if (uVar26 < local_108) {
                  uVar30 = uVar26;
                }
                psVar36 = psVar35;
                uVar27 = uVar24;
                if (uVar24 < uVar30) {
                  if ((uint)local_100 < uVar26) {
                    uVar26 = (uint)local_100;
                  }
                  if (local_110 <= uVar26) {
                    uVar26 = local_110;
                  }
                  iVar31 = 0;
                  psVar37 = psVar13;
                  do {
                    psVar36 = local_120;
                    if (*(char *)((long)psVar35 + (ulong)uVar24) !=
                        *(char *)((long)psVar37 + (ulong)uVar24)) {
                      uVar27 = uVar24 + iVar31;
                      break;
                    }
                    iVar31 = iVar31 + 1;
                    psVar37 = (short *)((long)psVar37 + 1);
                    psVar35 = (short *)((long)psVar35 + 1);
                    uVar27 = uVar30;
                  } while ((uVar24 - uVar26) + iVar31 != 0);
                }
                psVar35 = psVar36;
                if (1 < uVar27 - uVar24) {
                  uVar30 = iVar15 + (int)local_a0;
                  uVar12 = (*local_e8)[iVar15 - 2U];
                  local_84 = (uint)lzma_rc_prices
                                   [*(ushort *)(local_58 + (ulong)(uVar30 & uVar38) * 2) >> 4];
                  local_50 = (ulong)(uVar27 - uVar24);
                  local_88 = get_literal_price(coder,uVar30,
                                               (uint)*(byte *)((long)psVar36 + (ulong)(iVar15 - 1)),
                                               true,(uint)*(byte *)((long)psVar13 +
                                                                   (uVar32 & 0xffffffff)),
                                               (uint)*(byte *)((long)psVar36 + (uVar32 & 0xffffffff)
                                                              ));
                  auVar62 = _DAT_00583f20;
                  auVar64 = _DAT_0057a050;
                  auVar63 = _DAT_0057a040;
                  uVar24 = iVar15 + (int)local_a0 + 1U & uVar38;
                  uVar6 = coder->is_match[5][uVar24];
                  uVar7 = coder->is_rep[5];
                  uVar30 = (int)local_50 + uVar41 + 1;
                  if (uVar23 < uVar30) {
                    lVar28 = ~(ulong)uVar23 + (ulong)uVar30;
                    uVar32 = (ulong)(iVar15 + uVar11);
                    if (iVar15 + uVar11 < local_188) {
                      uVar32 = local_188;
                    }
                    auVar49._8_4_ = (int)lVar28;
                    auVar49._0_8_ = lVar28;
                    auVar49._12_4_ = (int)((ulong)lVar28 >> 0x20);
                    puVar17 = local_f8 + uVar32 * 0xb;
                    uVar29 = 0;
                    do {
                      auVar54._8_4_ = (int)uVar29;
                      auVar54._0_8_ = uVar29;
                      auVar54._12_4_ = (int)(uVar29 >> 0x20);
                      auVar47 = (auVar54 | auVar63) ^ auVar64;
                      iVar15 = SUB164(auVar49 ^ auVar64,0);
                      bVar46 = iVar15 < auVar47._0_4_;
                      iVar31 = SUB164(auVar49 ^ auVar64,4);
                      iVar57 = auVar47._4_4_;
                      if ((bool)(~(iVar31 < iVar57 || iVar57 == iVar31 && bVar46) & 1)) {
                        puVar17[-0x21] = 0x40000000;
                      }
                      if (iVar31 >= iVar57 && (iVar57 != iVar31 || !bVar46)) {
                        puVar17[-0x16] = 0x40000000;
                      }
                      auVar47 = (auVar54 | auVar62) ^ auVar64;
                      iVar57 = auVar47._4_4_;
                      if (iVar57 <= iVar31 && (iVar57 != iVar31 || auVar47._0_4_ <= iVar15)) {
                        puVar17[-0xb] = 0x40000000;
                        *puVar17 = 0x40000000;
                      }
                      uVar29 = uVar29 + 4;
                      puVar17 = puVar17 + 0x2c;
                      uVar23 = uVar30;
                    } while ((((uVar27 + uVar11) - uVar32) + 3 & 0xfffffffffffffffc) != uVar29);
                  }
                  uVar24 = uVar12 + iVar43 + local_88 + local_84 +
                           (uint)lzma_rc_prices[(ulong)(uVar6 >> 4) ^ 0x7f] +
                           (uint)lzma_rc_prices[(ulong)(uVar7 >> 4) ^ 0x7f] +
                           local_d0[uVar24][(int)local_50 - 2] +
                           (uint)lzma_rc_prices[(ulong)(coder->is_rep0_long[5][uVar24] >> 4) ^ 0x7f]
                           + (uint)lzma_rc_prices[coder->is_rep0[5] >> 4];
                  psVar35 = local_120;
                  if (uVar24 < coder->opts[uVar30].price) {
                    coder->opts[uVar30].price = uVar24;
                    coder->opts[uVar30].pos_prev = uVar41 + 1;
                    coder->opts[uVar30].back_prev = 0;
                    coder->opts[uVar30].prev_1_is_literal = true;
                    coder->opts[uVar30].prev_2 = true;
                    coder->opts[uVar30].pos_prev_2 = uVar11;
                    coder->opts[uVar30].back_prev_2 = uVar22;
                  }
                }
                local_188 = (ulong)uVar23;
              }
              lVar39 = lVar39 + 1;
            } while (lVar39 != 4);
            uVar23 = (uint)local_68;
            uVar41 = local_10c;
            uVar24 = uVar23;
            if (uVar44 < uVar23) {
              uVar41 = 0;
              do {
                uVar24 = uVar41;
                uVar41 = uVar24 + 1;
              } while (local_98[uVar24].len < uVar44);
              local_98[uVar24].len = uVar44;
              uVar24 = uVar44;
            }
            if ((uint)uVar20 <= uVar24) {
              uVar24 = uVar24 + uVar11;
              uVar44 = (uint)local_118;
              if ((uint)local_188 < uVar24) {
                lVar39 = ~local_188 + (ulong)uVar24;
                if (uVar44 <= uVar23) {
                  uVar23 = uVar44;
                }
                if ((uint)local_100 <= uVar23) {
                  uVar23 = (uint)local_100;
                }
                if (local_110 <= uVar23) {
                  uVar23 = local_110;
                }
                auVar50._8_4_ = (int)lVar39;
                auVar50._0_8_ = lVar39;
                auVar50._12_4_ = (int)((ulong)lVar39 >> 0x20);
                puVar17 = local_f8 + local_188 * 0xb;
                uVar32 = 0;
                do {
                  auVar55._8_4_ = (int)uVar32;
                  auVar55._0_8_ = uVar32;
                  auVar55._12_4_ = (int)(uVar32 >> 0x20);
                  auVar47 = (auVar55 | auVar63) ^ auVar64;
                  iVar15 = SUB164(auVar50 ^ auVar64,0);
                  bVar46 = iVar15 < auVar47._0_4_;
                  iVar43 = SUB164(auVar50 ^ auVar64,4);
                  iVar31 = auVar47._4_4_;
                  if ((bool)(~(iVar43 < iVar31 || iVar31 == iVar43 && bVar46) & 1)) {
                    puVar17[-0x21] = 0x40000000;
                  }
                  if (iVar43 >= iVar31 && (iVar31 != iVar43 || !bVar46)) {
                    puVar17[-0x16] = 0x40000000;
                  }
                  auVar47 = (auVar55 | auVar62) ^ auVar64;
                  iVar31 = auVar47._4_4_;
                  if (iVar31 <= iVar43 && (iVar31 != iVar43 || auVar47._0_4_ <= iVar15)) {
                    puVar17[-0xb] = 0x40000000;
                    *puVar17 = 0x40000000;
                  }
                  uVar32 = uVar32 + 4;
                  puVar17 = puVar17 + 0x2c;
                } while ((((uVar23 + uVar11) - local_188) + 3 & 0xfffffffffffffffc) != uVar32);
                local_188 = (ulong)uVar24;
              }
              bVar3 = lzma_rc_prices[local_78];
              uVar32 = 0xffffffff;
              do {
                uVar32 = (ulong)((int)uVar32 + 1);
              } while (local_98[uVar32].len < (uint)uVar20);
              local_118 = (ulong)(uVar44 + 1);
              local_c8 = (long)*local_d8 +
                         (ulong)(((uint)(STATE_SHORTREP_LIT < lVar25) * 3 + 7) * 0x20);
              uVar29 = uVar20;
              local_10c = uVar41;
              do {
                uVar44 = local_98[uVar32].dist;
                iVar15 = 0x3c;
                if (-1 < (int)uVar44) {
                  iVar15 = 0x24;
                }
                sVar14 = 0x1e;
                if (-1 < (int)uVar44) {
                  sVar14 = 0x12;
                }
                if (uVar44 < 0x80000) {
                  iVar15 = 0xc;
                  sVar14 = 6;
                }
                uVar22 = local_98[uVar32].len;
                uVar23 = (uint)uVar20;
                iVar43 = (int)lVar34;
                iVar31 = 0;
                while( true ) {
                  uVar30 = uVar23 + iVar31;
                  uVar24 = (uVar23 - 2) + iVar31;
                  uVar41 = 3;
                  if (uVar30 < 6) {
                    uVar41 = uVar24;
                  }
                  if (uVar44 < 0x80) {
                    uVar12 = local_40[uVar41][uVar44];
                  }
                  else {
                    uVar12 = coder->align_prices[uVar44 & 0xf] +
                             local_38[uVar41][(uint)""[uVar44 >> sVar14] + iVar15];
                  }
                  uVar26 = uVar12 + iVar19 + (uint)bVar3 +
                           *(int *)((long)*local_90 + (ulong)((uVar23 - 2) + iVar31) * 4 + local_e0)
                  ;
                  uVar41 = uVar23 + iVar43 + iVar31 + 1;
                  if (uVar26 < coder->opts[uVar41].price) {
                    coder->opts[uVar41].price = uVar26;
                    coder->opts[uVar41].pos_prev = uVar11;
                    coder->opts[uVar41].back_prev = uVar44 + 4;
                    coder->opts[uVar41].prev_1_is_literal = false;
                  }
                  if (uVar24 + 2 == uVar22) break;
                  iVar31 = iVar31 + 1;
                }
                uVar29 = (ulong)((int)uVar29 + iVar31 + 1);
                lVar39 = (uVar40 - 2) - (ulong)uVar44;
                uVar24 = uVar23 + iVar31 + 1;
                uVar41 = (int)local_118 + uVar30;
                if (local_108 <= uVar41) {
                  uVar41 = local_108;
                }
                uVar20 = (ulong)uVar24;
                if (uVar24 < uVar41) {
                  uVar20 = uVar29;
                  do {
                    if (*(uint8_t *)((long)local_120 + uVar20) != puVar8[uVar20 + lVar39]) break;
                    uVar20 = uVar20 + 1;
                  } while (uVar20 < uVar41);
                }
                iVar15 = (int)uVar20;
                uVar41 = (~uVar23 + iVar15) - iVar31;
                if (1 < uVar41) {
                  local_e8 = (uint32_t (*) [272])CONCAT44(local_e8._4_4_,uVar24);
                  uVar27 = (int)local_a8 + uVar30;
                  uVar24 = uVar27 & uVar38;
                  bVar21 = lzma_rc_prices[*(ushort *)(local_c8 + (ulong)uVar24 * 2) >> 4];
                  uVar22 = get_literal_price(coder,uVar27,
                                             (uint)*(byte *)((long)local_120 +
                                                            (ulong)((uVar23 + iVar31) - 1)),true,
                                             (uint)puVar8[(ulong)uVar30 + lVar39],
                                             (uint)*(byte *)((long)local_120 + (ulong)uVar30));
                  auVar62 = _DAT_00583f20;
                  auVar64 = _DAT_0057a050;
                  auVar63 = _DAT_0057a040;
                  uVar24 = uVar24 + 1 & uVar38;
                  uVar6 = coder->is_match[4][uVar24];
                  uVar7 = coder->is_rep[4];
                  uVar41 = uVar41 + iVar43 + uVar30 + 2;
                  if ((uint)local_188 < uVar41) {
                    lVar39 = (uVar11 + iVar15) - local_188;
                    lVar28 = ~local_188 + (ulong)uVar41;
                    auVar51._8_4_ = (int)lVar28;
                    auVar51._0_8_ = lVar28;
                    auVar51._12_4_ = (int)((ulong)lVar28 >> 0x20);
                    puVar17 = local_f8 + local_188 * 0xb;
                    uVar20 = 0;
                    do {
                      auVar56._8_4_ = (int)uVar20;
                      auVar56._0_8_ = uVar20;
                      auVar56._12_4_ = (int)(uVar20 >> 0x20);
                      auVar47 = (auVar56 | auVar63) ^ auVar64;
                      iVar57 = SUB164(auVar51 ^ auVar64,0);
                      bVar46 = iVar57 < auVar47._0_4_;
                      iVar59 = SUB164(auVar51 ^ auVar64,4);
                      iVar61 = auVar47._4_4_;
                      if ((bool)(~(iVar59 < iVar61 || iVar61 == iVar59 && bVar46) & 1)) {
                        puVar17[-0x21] = 0x40000000;
                      }
                      if (iVar59 >= iVar61 && (iVar61 != iVar59 || !bVar46)) {
                        puVar17[-0x16] = 0x40000000;
                      }
                      auVar47 = (auVar56 | auVar62) ^ auVar64;
                      iVar61 = auVar47._4_4_;
                      if (iVar61 <= iVar59 && (iVar61 != iVar59 || auVar47._0_4_ <= iVar57)) {
                        puVar17[-0xb] = 0x40000000;
                        *puVar17 = 0x40000000;
                      }
                      uVar20 = uVar20 + 4;
                      puVar17 = puVar17 + 0x2c;
                      local_188 = (ulong)uVar41;
                    } while ((lVar39 + 3U & 0xfffffffffffffffc) != uVar20);
                  }
                  uVar23 = uVar26 + bVar21 + uVar22 +
                           (uint)lzma_rc_prices[(ulong)(uVar7 >> 4) ^ 0x7f] +
                           (uint)lzma_rc_prices[(ulong)(uVar6 >> 4) ^ 0x7f] +
                           local_d0[uVar24][((iVar15 - uVar23) - iVar31) - 3] +
                           (uint)lzma_rc_prices[(ulong)(coder->is_rep0_long[4][uVar24] >> 4) ^ 0x7f]
                           + (uint)lzma_rc_prices[coder->is_rep0[4] >> 4];
                  if (uVar23 < coder->opts[uVar41].price) {
                    coder->opts[uVar41].price = uVar23;
                    coder->opts[uVar41].pos_prev = iVar43 + 2 + uVar30;
                    coder->opts[uVar41].back_prev = 0;
                    coder->opts[uVar41].prev_1_is_literal = true;
                    coder->opts[uVar41].prev_2 = true;
                    coder->opts[uVar41].pos_prev_2 = uVar11;
                    coder->opts[uVar41].back_prev_2 = uVar44 + 4;
                  }
                  uVar24 = (uint)local_e8;
                }
                uVar20 = (ulong)uVar24;
                uVar44 = (int)uVar32 + 1;
                uVar32 = (ulong)uVar44;
              } while (uVar44 != local_10c);
            }
          }
          lVar34 = lVar34 + 1;
          iVar19 = (int)local_100 + -1;
          iVar15 = (int)local_a8;
          uVar20 = local_80;
        } while (local_80 < local_188);
        uVar38 = coder->opts[local_80 & 0xffffffff].pos_prev;
        uVar11 = coder->opts[local_80 & 0xffffffff].back_prev;
        coder->opts_end_index = (uint32_t)local_80;
        do {
          uVar40 = (ulong)uVar38;
          uVar20 = local_80 & 0xffffffff;
          if (coder->opts[uVar20].prev_1_is_literal == false) {
            uVar44 = coder->opts[uVar40].pos_prev;
            uVar22 = coder->opts[uVar40].back_prev;
          }
          else {
            coder->opts[uVar40].prev_1_is_literal = false;
            uVar44 = uVar38 - 1;
            uVar22 = 0xffffffff;
            if (coder->opts[uVar20].prev_2 == true) {
              coder->opts[uVar44].prev_1_is_literal = false;
              uVar12 = coder->opts[uVar20].back_prev_2;
              coder->opts[uVar44].pos_prev = coder->opts[uVar20].pos_prev_2;
              coder->opts[uVar44].back_prev = uVar12;
            }
          }
          coder->opts[uVar40].back_prev = uVar11;
          coder->opts[uVar40].pos_prev = (uint32_t)local_80;
          bVar46 = uVar38 != 0;
          local_80 = uVar40;
          uVar38 = uVar44;
          uVar11 = uVar22;
        } while (bVar46);
        uVar38 = coder->opts[0].pos_prev;
        coder->opts_current_index = uVar38;
        *local_130 = uVar38;
        uVar22 = coder->opts[0].back_prev;
        goto LAB_004ebed2;
      }
      *local_138 = uVar22;
      goto LAB_004ebff8;
    }
  }
  *local_138 = 0xffffffff;
LAB_004ebff8:
  *local_130 = 1;
  return;
}

Assistant:

extern void
lzma_lzma_optimum_normal(lzma_coder *LZMA_RESTRICT coder, lzma_mf *LZMA_RESTRICT mf,
		uint32_t *LZMA_RESTRICT back_res, uint32_t *LZMA_RESTRICT len_res,
		uint32_t position)
{
	uint32_t reps[REP_DISTANCES];
	uint32_t len_end;
	uint32_t cur;

	// If we have symbols pending, return the next pending symbol.
	if (coder->opts_end_index != coder->opts_current_index) {
		assert(mf->read_ahead > 0);
		*len_res = coder->opts[coder->opts_current_index].pos_prev
				- coder->opts_current_index;
		*back_res = coder->opts[coder->opts_current_index].back_prev;
		coder->opts_current_index = coder->opts[
				coder->opts_current_index].pos_prev;
		return;
	}

	// Update the price tables. In LZMA SDK <= 4.60 (and possibly later)
	// this was done in both initialization function and in the main loop.
	// In liblzma they were moved into this single place.
	if (mf->read_ahead == 0) {
		if (coder->match_price_count >= (1 << 7))
			fill_distances_prices(coder);

		if (coder->align_price_count >= ALIGN_TABLE_SIZE)
			fill_align_prices(coder);
	}

	// TODO: This needs quite a bit of cleaning still. But splitting
	// the original function into two pieces makes it at least a little
	// more readable, since those two parts don't share many variables.

	len_end = helper1(coder, mf, back_res, len_res, position);
	if (len_end == UINT32_MAX)
		return;


	memcpy(reps, coder->reps, sizeof(reps));

	for (cur = 1; cur < len_end; ++cur) {
		assert(cur < OPTS);

		coder->longest_match_length = mf_find(
				mf, &coder->matches_count, coder->matches);

		if (coder->longest_match_length >= mf->nice_len)
			break;

		len_end = helper2(coder, reps, mf_ptr(mf) - 1, len_end,
				position + cur, cur, mf->nice_len,
				my_min(mf_avail(mf) + 1, OPTS - 1 - cur));
	}

	backward(coder, len_res, back_res, cur);
	return;
}